

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O0

void __thiscall
ylt::metric::detail::summary_impl<unsigned_long,_6UL>::data_copy_t::inc(data_copy_t *this)

{
  bool bVar1;
  reference __x;
  pair<short,_unsigned_long> *in_RDI;
  __unspec local_a;
  type local_9;
  
  *(int *)((long)&(((_Vector_base<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_>
                     *)&in_RDI[3].first)->_M_impl).super__Vector_impl_data._M_start +
          (long)*(int *)&in_RDI[3].second * 4) =
       *(int *)((long)&(((_Vector_base<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_>
                          *)&in_RDI[3].first)->_M_impl).super__Vector_impl_data._M_start +
               (long)*(int *)&in_RDI[3].second * 4) + 1;
  __x = std::
        vector<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_>::
        operator[]((vector<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_>
                    *)in_RDI,(long)*(int *)(in_RDI + 3));
  std::vector<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_>::
  operator[]((vector<std::pair<short,_unsigned_long>,_std::allocator<std::pair<short,_unsigned_long>_>_>
              *)&in_RDI[1].second,(long)*(int *)&in_RDI[3].field_0x4);
  local_9 = (type)std::operator<=><short,unsigned_long>(__x,in_RDI);
  std::__cmp_cat::__unspec::__unspec(&local_a,(__unspec *)0x0);
  bVar1 = std::operator<=(local_9);
  if (bVar1) {
    *(undefined4 *)&in_RDI[3].second = 0;
  }
  else {
    *(undefined4 *)&in_RDI[3].second = 1;
  }
  return;
}

Assistant:

void inc() {
      index[smaller_one]++;
      if (arr[0][index[0]] <= arr[1][index[1]]) {
        smaller_one = 0;
      }
      else {
        smaller_one = 1;
      }
    }